

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void append_slash(char *name)

{
  size_t sVar1;
  
  if ((*name != '\0') && (sVar1 = strlen(name), name[sVar1 - 1] != '/')) {
    (name + sVar1)[0] = '/';
    (name + sVar1)[1] = '\0';
  }
  return;
}

Assistant:

void append_slash(char *name)
{
#if defined(WIN32)
    static const char dirsep = '\\';
#else
    static const char dirsep = '/';
#endif
    char *ptr;

    if (!*name)
	return;
    ptr = name + (strlen(name) - 1);
    if (*ptr != dirsep) {
	*++ptr = dirsep;
	*++ptr = '\0';
    }
    return;
}